

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

Maybe<kj::Array<kj::String>_> *
kj::parse::
Many_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'#'>,_kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,_'_'>_>,_kj::_::Tuple<>_>,_kj::parse::Transform_<kj::parse::Many_<kj::parse::CharGroup_,_false>,_kj::parse::_::ArrayToString>,_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,_'\n'>,_const_kj::parse::EndOfInput__&>_>_&>,_true>
::Impl<capnp::compiler::Lexer::ParserInput,_kj::String>::apply
          (Maybe<kj::Array<kj::String>_> *__return_storage_ptr__,
          Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,____>_>,_kj::_::Tuple<>_>,_kj::parse::Transform_<kj::parse::Many_<kj::parse::CharGroup_,_false>,_kj::parse::_::ArrayToString>,_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,___n_>,_const_kj::parse::EndOfInput__&>_>_&>
          *subParser,ParserInput *input)

{
  char *pcVar1;
  String *pSVar2;
  RemoveConst<kj::String> *pRVar3;
  String *pSVar4;
  Maybe<kj::Array<kj::String>_> *pMVar5;
  bool bVar6;
  long lVar7;
  char *pcVar8;
  size_t sVar9;
  Results results;
  NullableValue<kj::String> subResult;
  ParserInput subInput;
  Vector<kj::String> local_c8;
  char local_a0;
  char *local_98;
  size_t sStack_90;
  ArrayDisposer *pAStack_88;
  Maybe<kj::Array<kj::String>_> *local_80;
  ParserInput local_78;
  Maybe<kj::String> local_50;
  
  local_c8.builder.ptr = (String *)0x0;
  local_c8.builder.pos = (String *)0x0;
  local_c8.builder.endPtr = (String *)0x0;
  local_80 = __return_storage_ptr__;
  do {
    pcVar8 = (input->super_IteratorInput<char,_const_char_*>).pos;
    pcVar1 = (input->super_IteratorInput<char,_const_char_*>).end;
    if (pcVar8 == pcVar1) break;
    local_78.begin = input->begin;
    local_78.super_IteratorInput<char,_const_char_*>.parent =
         &input->super_IteratorInput<char,_const_char_*>;
    local_78.super_IteratorInput<char,_const_char_*>.pos = pcVar8;
    local_78.super_IteratorInput<char,_const_char_*>.end = pcVar1;
    local_78.super_IteratorInput<char,_const_char_*>.best = pcVar8;
    Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'#'>,_kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,_'_'>_>,_kj::_::Tuple<>_>,_kj::parse::Transform_<kj::parse::Many_<kj::parse::CharGroup_,_false>,_kj::parse::_::ArrayToString>,_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,_'\n'>,_const_kj::parse::EndOfInput__&>_>_&>
    ::parseNext<capnp::compiler::Lexer::ParserInput>(&local_50,subParser,&local_78);
    bVar6 = local_50.ptr.isSet;
    local_a0 = local_50.ptr.isSet;
    if (local_50.ptr.isSet == true) {
      local_98 = local_50.ptr.field_1.value.content.ptr;
      sStack_90 = local_50.ptr.field_1.value.content.size_;
      pAStack_88 = local_50.ptr.field_1.value.content.disposer;
      local_50.ptr.field_1.value.content.ptr = (char *)0x0;
      local_50.ptr.field_1.value.content.size_ = 0;
      ((IteratorInput<char,_const_char_*> *)
      &(local_78.super_IteratorInput<char,_const_char_*>.parent)->parent)->pos =
           local_78.super_IteratorInput<char,_const_char_*>.pos;
      if (local_c8.builder.pos == local_c8.builder.endPtr) {
        sVar9 = ((long)local_c8.builder.endPtr - (long)local_c8.builder.ptr >> 3) *
                0x5555555555555556;
        if (local_c8.builder.endPtr == local_c8.builder.ptr) {
          sVar9 = 4;
        }
        Vector<kj::String>::setCapacity(&local_c8,sVar9);
      }
      ((local_c8.builder.pos)->content).ptr = local_98;
      ((local_c8.builder.pos)->content).size_ = sStack_90;
      ((local_c8.builder.pos)->content).disposer = pAStack_88;
      local_98 = (char *)0x0;
      sStack_90 = 0;
      local_c8.builder.pos = local_c8.builder.pos + 1;
    }
    sVar9 = sStack_90;
    pcVar8 = local_98;
    if ((local_a0 == '\x01') && (local_98 != (char *)0x0)) {
      local_98 = (char *)0x0;
      sStack_90 = 0;
      (**pAStack_88->_vptr_ArrayDisposer)(pAStack_88,pcVar8,1,sVar9,sVar9,0);
    }
    if ((ParserInput *)local_78.super_IteratorInput<char,_const_char_*>.parent != (ParserInput *)0x0
       ) {
      pcVar8 = local_78.super_IteratorInput<char,_const_char_*>.best;
      if (local_78.super_IteratorInput<char,_const_char_*>.best <
          local_78.super_IteratorInput<char,_const_char_*>.pos) {
        pcVar8 = local_78.super_IteratorInput<char,_const_char_*>.pos;
      }
      pcVar1 = ((IteratorInput<char,_const_char_*> *)
               &(local_78.super_IteratorInput<char,_const_char_*>.parent)->parent)->best;
      if (pcVar8 <= pcVar1) {
        pcVar8 = pcVar1;
      }
      ((IteratorInput<char,_const_char_*> *)
      &(local_78.super_IteratorInput<char,_const_char_*>.parent)->parent)->best = pcVar8;
    }
  } while (bVar6 != false);
  pMVar5 = local_80;
  if ((long)local_c8.builder.pos - (long)local_c8.builder.ptr == 0) {
    (local_80->ptr).isSet = false;
  }
  else {
    if (local_c8.builder.pos != local_c8.builder.endPtr) {
      Vector<kj::String>::setCapacity
                (&local_c8,
                 ((long)local_c8.builder.pos - (long)local_c8.builder.ptr >> 3) *
                 -0x5555555555555555);
    }
    pSVar2 = local_c8.builder.ptr;
    lVar7 = (long)local_c8.builder.pos - (long)local_c8.builder.ptr;
    local_c8.builder.ptr = (String *)0x0;
    local_c8.builder.pos = (String *)0x0;
    local_c8.builder.endPtr = (String *)0x0;
    (pMVar5->ptr).isSet = true;
    (pMVar5->ptr).field_1.value.ptr = pSVar2;
    (pMVar5->ptr).field_1.value.size_ = (lVar7 >> 3) * -0x5555555555555555;
    (pMVar5->ptr).field_1.value.disposer = local_c8.builder.disposer;
  }
  pSVar4 = local_c8.builder.endPtr;
  pRVar3 = local_c8.builder.pos;
  pSVar2 = local_c8.builder.ptr;
  if (local_c8.builder.ptr != (String *)0x0) {
    local_c8.builder.ptr = (String *)0x0;
    local_c8.builder.pos = (RemoveConst<kj::String> *)0x0;
    local_c8.builder.endPtr = (String *)0x0;
    (**(local_c8.builder.disposer)->_vptr_ArrayDisposer)
              (local_c8.builder.disposer,pSVar2,0x18,
               ((long)pRVar3 - (long)pSVar2 >> 3) * -0x5555555555555555,
               ((long)pSVar4 - (long)pSVar2 >> 3) * -0x5555555555555555,
               ArrayDisposer::Dispose_<kj::String,_false>::destruct);
  }
  return pMVar5;
}

Assistant:

static Maybe<Array<Output>> apply(const SubParser& subParser, Input& input) {
    typedef Vector<OutputType<SubParser, Input>> Results;
    Results results;

    while (!input.atEnd()) {
      Input subInput(input);

      KJ_IF_MAYBE(subResult, subParser(subInput)) {
        subInput.advanceParent();
        results.add(kj::mv(*subResult));
      } else {
        break;
      }
    }